

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrInteractionProfileDpadBindingEXT *value)

{
  pointer *this;
  pointer *this_00;
  XrHapticVibration *pXVar1;
  XrHapticAmplitudeEnvelopeVibrationFB *pXVar2;
  XrHapticPcmVibrationFB *pXVar3;
  ValidateXrHandleResult VVar4;
  XrResult XVar5;
  allocator local_719;
  string local_718 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6f8;
  allocator local_6d9;
  string local_6d8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6b8;
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [8];
  string error_message_6;
  XrHapticPcmVibrationFB *new_hapticpcmvibrationfb_value_1;
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [8];
  string error_message_5;
  XrHapticAmplitudeEnvelopeVibrationFB *new_hapticamplitudeenvelopevibrationfb_value_1;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [8];
  string error_message_4;
  XrHapticVibration *new_hapticvibration_value_1;
  string local_560 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_540;
  allocator local_521;
  string local_520 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_500;
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [8];
  string error_message_3;
  XrHapticPcmVibrationFB *new_hapticpcmvibrationfb_value;
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [8];
  string error_message_2;
  XrHapticAmplitudeEnvelopeVibrationFB *new_hapticamplitudeenvelopevibrationfb_value;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [8];
  string error_message_1;
  XrHapticVibration *new_hapticvibration_value;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_390;
  allocator local_371;
  string local_370 [32];
  XrActionSet_T local_350 [32];
  ostringstream local_330 [8];
  ostringstream oss;
  allocator local_1b1;
  ValidateXrHandleResult handle_result;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrInteractionProfileDpadBindingEXT *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrInteractionProfileDpadBindingEXT",
               value->type,"VUID-XrInteractionProfileDpadBindingEXT-type-type",
               XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT,
               "XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"VUID-XrInteractionProfileDpadBindingEXT-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrInteractionProfileDpadBindingEXT : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrInteractionProfileDpadBindingEXT-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&handle_result,
                 "Multiple structures of the same type(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)&handle_result);
      std::__cxx11::string::~string((string *)&handle_result);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    VVar4 = VerifyXrActionSetHandle(&value->actionSet);
    if (VVar4 == VALIDATE_XR_HANDLE_SUCCESS) {
      if (((value->onHaptic != (XrHapticBaseHeader *)0x0) &&
          (pXVar1 = (XrHapticVibration *)value->onHaptic, pXVar1->type == XR_TYPE_HAPTIC_VIBRATION))
         && (pXVar1 != (XrHapticVibration *)0x0)) {
        XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,pXVar1);
        if (XVar5 != XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3d8,"Structure XrInteractionProfileDpadBindingEXT member onHaptic",
                     &local_3d9);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
          std::__cxx11::string::operator+=(local_3d8," is invalid");
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_400,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                     &local_401);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&new_hapticamplitudeenvelopevibrationfb_value,objects_info);
          CoreValidLogMessage(instance_info,(string *)local_400,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&new_hapticamplitudeenvelopevibrationfb_value,(string *)local_3d8);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                  &new_hapticamplitudeenvelopevibrationfb_value);
          std::__cxx11::string::~string(local_400);
          std::allocator<char>::~allocator((allocator<char> *)&local_401);
          std::__cxx11::string::~string(local_3d8);
          return XR_ERROR_VALIDATION_FAILURE;
        }
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
      }
      if (((value->onHaptic != (XrHapticBaseHeader *)0x0) &&
          (pXVar2 = (XrHapticAmplitudeEnvelopeVibrationFB *)value->onHaptic,
          pXVar2->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB)) &&
         (pXVar2 != (XrHapticAmplitudeEnvelopeVibrationFB *)0x0)) {
        XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,pXVar2);
        if (XVar5 != XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_448,"Structure XrInteractionProfileDpadBindingEXT member onHaptic",
                     &local_449);
          std::allocator<char>::~allocator((allocator<char> *)&local_449);
          std::__cxx11::string::operator+=(local_448," is invalid");
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_470,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                     &local_471);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&new_hapticpcmvibrationfb_value,objects_info);
          CoreValidLogMessage(instance_info,(string *)local_470,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&new_hapticpcmvibrationfb_value,(string *)local_448);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                  &new_hapticpcmvibrationfb_value);
          std::__cxx11::string::~string(local_470);
          std::allocator<char>::~allocator((allocator<char> *)&local_471);
          std::__cxx11::string::~string(local_448);
          return XR_ERROR_VALIDATION_FAILURE;
        }
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
      }
      if (((value->onHaptic != (XrHapticBaseHeader *)0x0) &&
          (pXVar3 = (XrHapticPcmVibrationFB *)value->onHaptic,
          pXVar3->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB)) &&
         (pXVar3 != (XrHapticPcmVibrationFB *)0x0)) {
        XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,pXVar3);
        if (XVar5 != XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4b8,"Structure XrInteractionProfileDpadBindingEXT member onHaptic",
                     &local_4b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
          std::__cxx11::string::operator+=(local_4b8," is invalid");
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4e0,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                     &local_4e1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_500,objects_info);
          CoreValidLogMessage(instance_info,(string *)local_4e0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_500,(string *)local_4b8);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_500);
          std::__cxx11::string::~string(local_4e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
          std::__cxx11::string::~string(local_4b8);
          return XR_ERROR_VALIDATION_FAILURE;
        }
        valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
      }
      if ((value->onHaptic == (XrHapticBaseHeader *)0x0) ||
         (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                value->onHaptic),
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
        if ((value->offHaptic != (XrHapticBaseHeader *)0x0) &&
           ((pXVar1 = (XrHapticVibration *)value->offHaptic,
            pXVar1->type == XR_TYPE_HAPTIC_VIBRATION && (pXVar1 != (XrHapticVibration *)0x0)))) {
          XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,pXVar1
                                  );
          if (XVar5 != XR_SUCCESS) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_590,"Structure XrInteractionProfileDpadBindingEXT member offHaptic",
                       &local_591);
            std::allocator<char>::~allocator((allocator<char> *)&local_591);
            std::__cxx11::string::operator+=(local_590," is invalid");
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_5b8,"VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                       &local_5b9);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &new_hapticamplitudeenvelopevibrationfb_value_1,objects_info);
            CoreValidLogMessage(instance_info,(string *)local_5b8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&new_hapticamplitudeenvelopevibrationfb_value_1,
                                (string *)local_590);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *
                    )&new_hapticamplitudeenvelopevibrationfb_value_1);
            std::__cxx11::string::~string(local_5b8);
            std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
            std::__cxx11::string::~string(local_590);
            return XR_ERROR_VALIDATION_FAILURE;
          }
          valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
        }
        if (((value->offHaptic != (XrHapticBaseHeader *)0x0) &&
            (pXVar2 = (XrHapticAmplitudeEnvelopeVibrationFB *)value->offHaptic,
            pXVar2->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB)) &&
           (pXVar2 != (XrHapticAmplitudeEnvelopeVibrationFB *)0x0)) {
          XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,pXVar2
                                  );
          if (XVar5 != XR_SUCCESS) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_600,"Structure XrInteractionProfileDpadBindingEXT member offHaptic",
                       &local_601);
            std::allocator<char>::~allocator((allocator<char> *)&local_601);
            std::__cxx11::string::operator+=(local_600," is invalid");
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_628,"VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                       &local_629);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &new_hapticpcmvibrationfb_value_1,objects_info);
            CoreValidLogMessage(instance_info,(string *)local_628,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&new_hapticpcmvibrationfb_value_1,(string *)local_600);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *
                    )&new_hapticpcmvibrationfb_value_1);
            std::__cxx11::string::~string(local_628);
            std::allocator<char>::~allocator((allocator<char> *)&local_629);
            std::__cxx11::string::~string(local_600);
            return XR_ERROR_VALIDATION_FAILURE;
          }
          valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
        }
        if (((value->offHaptic != (XrHapticBaseHeader *)0x0) &&
            (pXVar3 = (XrHapticPcmVibrationFB *)value->offHaptic,
            pXVar3->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB)) &&
           (pXVar3 != (XrHapticPcmVibrationFB *)0x0)) {
          XVar5 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,pXVar3
                                  );
          if (XVar5 != XR_SUCCESS) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_670,"Structure XrInteractionProfileDpadBindingEXT member offHaptic",
                       &local_671);
            std::allocator<char>::~allocator((allocator<char> *)&local_671);
            std::__cxx11::string::operator+=(local_670," is invalid");
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_698,"VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                       &local_699);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_6b8,objects_info);
            CoreValidLogMessage(instance_info,(string *)local_698,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_6b8,(string *)local_670);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_6b8);
            std::__cxx11::string::~string(local_698);
            std::allocator<char>::~allocator((allocator<char> *)&local_699);
            std::__cxx11::string::~string(local_670);
            return XR_ERROR_VALIDATION_FAILURE;
          }
          valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
        }
        if ((value->offHaptic == (XrHapticBaseHeader *)0x0) ||
           (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                  value->offHaptic),
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
          instance_info_local._4_4_ =
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6d8,"VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                     &local_6d9);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_6f8,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_718,
                     "Structure XrInteractionProfileDpadBindingEXT member offHaptic is invalid",
                     &local_719);
          CoreValidLogMessage(instance_info,(string *)local_6d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_6f8,(string *)local_718);
          std::__cxx11::string::~string(local_718);
          std::allocator<char>::~allocator((allocator<char> *)&local_719);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_6f8);
          std::__cxx11::string::~string(local_6d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
          instance_info_local._4_4_ =
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_520,"VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",&local_521
                  );
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_540,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_560,
                   "Structure XrInteractionProfileDpadBindingEXT member onHaptic is invalid",
                   (allocator *)((long)&new_hapticvibration_value_1 + 7));
        CoreValidLogMessage(instance_info,(string *)local_520,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_540,(string *)local_560);
        std::__cxx11::string::~string(local_560);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&new_hapticvibration_value_1 + 7));
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_540);
        std::__cxx11::string::~string(local_520);
        std::allocator<char>::~allocator((allocator<char> *)&local_521);
        instance_info_local._4_4_ =
             valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_330);
      std::operator<<((ostream *)local_330,"Invalid XrActionSet handle \"actionSet\" ");
      HandleToHexString<XrActionSet_T*>(local_350);
      std::operator<<((ostream *)local_330,(string *)local_350);
      std::__cxx11::string::~string((string *)local_350);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_370,"VUID-XrInteractionProfileDpadBindingEXT-actionSet-parameter",&local_371)
      ;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_390,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_370,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_390,(string *)&new_hapticvibration_value);
      std::__cxx11::string::~string((string *)&new_hapticvibration_value);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_390);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      instance_info_local._4_4_ = XR_ERROR_HANDLE_INVALID;
      std::__cxx11::ostringstream::~ostringstream(local_330);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrInteractionProfileDpadBindingEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrInteractionProfileDpadBindingEXT",
                             value->type, "VUID-XrInteractionProfileDpadBindingEXT-type-type", XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT, "XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrInteractionProfileDpadBindingEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrInteractionProfileDpadBindingEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrActionSetHandle(&value->actionSet);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrActionSet handle \"actionSet\" ";
            oss << HandleToHexString(value->actionSet);
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-actionSet-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
    {
        if (value->onHaptic != nullptr) {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(value->onHaptic);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                if (nullptr != new_hapticvibration_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticvibration_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member onHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
    {
        if (value->onHaptic != nullptr) {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(value->onHaptic);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                if (nullptr != new_hapticamplitudeenvelopevibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticamplitudeenvelopevibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member onHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
    {
        if (value->onHaptic != nullptr) {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(value->onHaptic);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                if (nullptr != new_hapticpcmvibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticpcmvibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member onHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate that the base-structure XrHapticBaseHeader is valid
    if (nullptr != value->onHaptic) {
        xr_result = ValidateXrStruct(instance_info, command_name,
                                                        objects_info, check_members, true, value->onHaptic);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-onHaptic-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
                                "Structure XrInteractionProfileDpadBindingEXT member onHaptic is invalid");
            return xr_result;
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticVibration and it is valid
    {
        if (value->offHaptic != nullptr) {
            const XrHapticVibration* new_hapticvibration_value = reinterpret_cast<const XrHapticVibration*>(value->offHaptic);
            if (new_hapticvibration_value->type == XR_TYPE_HAPTIC_VIBRATION) {
                if (nullptr != new_hapticvibration_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticvibration_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member offHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticAmplitudeEnvelopeVibrationFB and it is valid
    {
        if (value->offHaptic != nullptr) {
            const XrHapticAmplitudeEnvelopeVibrationFB* new_hapticamplitudeenvelopevibrationfb_value = reinterpret_cast<const XrHapticAmplitudeEnvelopeVibrationFB*>(value->offHaptic);
            if (new_hapticamplitudeenvelopevibrationfb_value->type == XR_TYPE_HAPTIC_AMPLITUDE_ENVELOPE_VIBRATION_FB) {
                if (nullptr != new_hapticamplitudeenvelopevibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticamplitudeenvelopevibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member offHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate if XrHapticBaseHeader is a child structure of type XrHapticPcmVibrationFB and it is valid
    {
        if (value->offHaptic != nullptr) {
            const XrHapticPcmVibrationFB* new_hapticpcmvibrationfb_value = reinterpret_cast<const XrHapticPcmVibrationFB*>(value->offHaptic);
            if (new_hapticpcmvibrationfb_value->type == XR_TYPE_HAPTIC_PCM_VIBRATION_FB) {
                if (nullptr != new_hapticpcmvibrationfb_value) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_hapticpcmvibrationfb_value);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrInteractionProfileDpadBindingEXT member offHaptic";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        }
                    }
            }
        }
    }
    // Validate that the base-structure XrHapticBaseHeader is valid
    if (nullptr != value->offHaptic) {
        xr_result = ValidateXrStruct(instance_info, command_name,
                                                        objects_info, check_members, true, value->offHaptic);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(instance_info, "VUID-XrInteractionProfileDpadBindingEXT-offHaptic-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
                                "Structure XrInteractionProfileDpadBindingEXT member offHaptic is invalid");
            return xr_result;
        }
    }
    // Everything checked out properly
    return xr_result;
}